

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::NegativeTest3::deinit(NegativeTest3 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  NegativeTest3 *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  if (this->m_so_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))(this->m_so_id);
    this->m_so_id = 0;
  }
  return;
}

Assistant:

void NegativeTest3::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_so_id != 0)
	{
		gl.deleteShader(m_so_id);

		m_so_id = 0;
	}
}